

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

float * ma_dr_wav_open_and_read_pcm_frames_f32
                  (ma_dr_wav_read_proc onRead,ma_dr_wav_seek_proc onSeek,void *pUserData,
                  uint *channelsOut,uint *sampleRateOut,ma_uint64 *totalFrameCountOut,
                  ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_bool32 mVar1;
  undefined4 *in_RCX;
  undefined4 *in_R8;
  undefined8 *in_R9;
  ma_dr_wav wav;
  ma_allocation_callbacks *in_stack_fffffffffffffe40;
  void *in_stack_fffffffffffffe48;
  ma_dr_wav_seek_proc in_stack_fffffffffffffe50;
  ma_dr_wav_read_proc in_stack_fffffffffffffe58;
  ma_dr_wav *in_stack_fffffffffffffe60;
  ma_dr_wav *in_stack_fffffffffffffe68;
  undefined8 local_8;
  
  if (in_RCX != (undefined4 *)0x0) {
    *in_RCX = 0;
  }
  if (in_R8 != (undefined4 *)0x0) {
    *in_R8 = 0;
  }
  if (in_R9 != (undefined8 *)0x0) {
    *in_R9 = 0;
  }
  mVar1 = ma_dr_wav_init(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                         in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                         in_stack_fffffffffffffe40);
  if (mVar1 == 0) {
    local_8 = (float *)0x0;
  }
  else {
    local_8 = ma_dr_wav__read_pcm_frames_and_close_f32
                        (in_stack_fffffffffffffe68,(uint *)in_stack_fffffffffffffe60,
                         (uint *)in_stack_fffffffffffffe58,(ma_uint64 *)in_stack_fffffffffffffe50);
  }
  return local_8;
}

Assistant:

MA_API float* ma_dr_wav_open_and_read_pcm_frames_f32(ma_dr_wav_read_proc onRead, ma_dr_wav_seek_proc onSeek, void* pUserData, unsigned int* channelsOut, unsigned int* sampleRateOut, ma_uint64* totalFrameCountOut, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_wav wav;
    if (channelsOut) {
        *channelsOut = 0;
    }
    if (sampleRateOut) {
        *sampleRateOut = 0;
    }
    if (totalFrameCountOut) {
        *totalFrameCountOut = 0;
    }
    if (!ma_dr_wav_init(&wav, onRead, onSeek, pUserData, pAllocationCallbacks)) {
        return NULL;
    }
    return ma_dr_wav__read_pcm_frames_and_close_f32(&wav, channelsOut, sampleRateOut, totalFrameCountOut);
}